

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cost_sensitive.cc
# Opt level: O2

char * COST_SENSITIVE::bufread_label(label *ld,char *c,io_buf *cache)

{
  size_t sVar1;
  ostream *poVar2;
  long lVar3;
  bool bVar4;
  wclass temp;
  char *local_40;
  wclass local_38;
  
  lVar3 = *(long *)c;
  v_array<COST_SENSITIVE::wclass>::clear(&ld->costs);
  local_40 = c + 8;
  sVar1 = io_buf::buf_read(cache,&local_40,(lVar3 << 0x24) >> 0x20);
  if (sVar1 < (ulong)(lVar3 << 4)) {
    poVar2 = std::operator<<((ostream *)&std::cout,"error in demarshal of cost data");
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  else {
    while (bVar4 = lVar3 != 0, lVar3 = lVar3 + -1, bVar4) {
      local_38._0_8_ = *(undefined8 *)local_40;
      local_38._8_8_ = *(undefined8 *)(local_40 + 8);
      local_40 = local_40 + 0x10;
      v_array<COST_SENSITIVE::wclass>::push_back(&ld->costs,&local_38);
    }
  }
  return local_40;
}

Assistant:

char* bufread_label(label* ld, char* c, io_buf& cache)
{
  size_t num = *(size_t*)c;
  ld->costs.clear();
  c += sizeof(size_t);
  size_t total = sizeof(wclass) * num;
  if (cache.buf_read(c, (int)total) < total)
  {
    cout << "error in demarshal of cost data" << endl;
    return c;
  }
  for (size_t i = 0; i < num; i++)
  {
    wclass temp = *(wclass*)c;
    c += sizeof(wclass);
    ld->costs.push_back(temp);
  }

  return c;
}